

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::RenderLineStrip<ImPlot::GetterFuncPtr,ImPlot::TransformerLogLin>
               (GetterFuncPtr *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  ImPlotContext *pIVar1;
  bool bVar2;
  int i;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float in_XMM1_Da;
  float in_XMM1_Db;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImVec2 p1;
  ImVec2 p2;
  ImPlotPoint local_58;
  
  pIVar1 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    LineStripRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin>::LineStripRenderer
              ((LineStripRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin> *)&local_58,
               getter,transformer,col,line_weight);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterFuncPtr,ImPlot::TransformerLogLin>>
              ((LineStripRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin> *)&local_58,
               DrawList,&pIVar1->CurrentPlot->PlotRect);
  }
  else {
    local_58.x = (double)(*getter->Getter)(getter->Data,0);
    local_58.y._4_4_ = in_XMM1_Db;
    local_58.y._0_4_ = in_XMM1_Da;
    p1 = TransformerLogLin::operator()(transformer,&local_58);
    for (iVar3 = 1; iVar3 < getter->Count; iVar3 = iVar3 + 1) {
      local_58.x = (double)(*getter->Getter)(getter->Data,iVar3);
      local_58.y._4_4_ = in_XMM1_Db;
      local_58.y._0_4_ = in_XMM1_Da;
      p2 = TransformerLogLin::operator()(transformer,&local_58);
      auVar6._8_8_ = 0;
      auVar6._0_4_ = p1.x;
      auVar6._4_4_ = p1.y;
      auVar7._8_4_ = extraout_XMM0_Dc;
      auVar7._0_4_ = p2.x;
      auVar7._4_4_ = p2.y;
      auVar7._12_4_ = extraout_XMM0_Dd;
      auVar7 = minps(auVar6,auVar7);
      uVar4 = -(uint)(p2.x <= p1.x);
      uVar5 = -(uint)(p2.y <= p1.y);
      in_XMM1_Da = (float)((uint)p1.x & uVar4);
      in_XMM1_Db = (float)((uint)p1.y & uVar5);
      local_58.y = (double)(CONCAT44(~uVar5 & (uint)p2.y,~uVar4 & (uint)p2.x) |
                           CONCAT44(in_XMM1_Db,in_XMM1_Da));
      local_58.x = auVar7._0_8_;
      bVar2 = ImRect::Overlaps(&pIVar1->CurrentPlot->PlotRect,(ImRect *)&local_58);
      if (bVar2) {
        ImDrawList::AddLine(DrawList,&p1,&p2,col,line_weight);
      }
      p1 = p2;
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}